

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampFormatCase::init
          (TextureBorderClampFormatCase *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  undefined8 *puVar3;
  deUint32 dVar4;
  pointer pIVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  GenericVec4 GVar11;
  TextureFormat texFormat;
  TextureFormatInfo texFormatInfo;
  TextureFormat local_f0;
  value_type local_e8;
  Vec4 local_68;
  TextureFormatInfo local_58;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  local_f0 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        &((this->super_TextureBorderClampTest).m_texture.
                          super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
                          m_data.ptr)->m_refTexture,
                        (this->super_TextureBorderClampTest).m_sampleMode);
  tcu::getTextureFormatInfo(&local_58,&local_f0);
  paVar1 = &local_e8.description.field_2;
  local_e8.lookupBias.m_data[0] = 0.0;
  local_e8.lookupBias.m_data[1] = 0.0;
  local_e8.lookupBias.m_data[2] = 0.0;
  local_e8.lookupBias.m_data[3] = 0.0;
  local_e8.lookupScale.m_data[0] = 0.0;
  local_e8.lookupScale.m_data[1] = 0.0;
  local_e8.lookupScale.m_data[2] = 0.0;
  local_e8.lookupScale.m_data[3] = 0.0;
  local_e8.borderColor.v._0_8_ = 0;
  local_e8.borderColor.v._8_8_ = 0;
  local_e8.description._M_string_length = 0;
  local_e8.description.field_2._M_local_buf[0] = '\0';
  local_e8.p0.m_data[0] = -1.5;
  local_e8.p0.m_data[1] = -3.0;
  local_e8.p1.m_data[0] = 1.5;
  local_e8.p1.m_data[1] = 2.5;
  local_68.m_data[0] = 0.3;
  local_68.m_data[1] = 0.7;
  local_68.m_data[2] = 0.2;
  local_68.m_data[3] = 0.5;
  local_e8.description._M_dataplus._M_p = (pointer)paVar1;
  GVar11 = mapToFormatColorRepresentable(&local_f0,&local_68);
  local_e8.borderColor.v._0_8_ = GVar11.v._0_8_;
  local_e8.borderColor.v._8_8_ = GVar11.v._8_8_;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.description._M_dataplus._M_p,
                    CONCAT71(local_e8.description.field_2._M_allocated_capacity._1_7_,
                             local_e8.description.field_2._M_local_buf[0]) + 1);
  }
  local_e8.lookupBias.m_data[0] = 0.0;
  local_e8.lookupBias.m_data[1] = 0.0;
  local_e8.lookupBias.m_data[2] = 0.0;
  local_e8.lookupBias.m_data[3] = 0.0;
  local_e8.lookupScale.m_data[0] = 0.0;
  local_e8.lookupScale.m_data[1] = 0.0;
  local_e8.lookupScale.m_data[2] = 0.0;
  local_e8.lookupScale.m_data[3] = 0.0;
  local_e8.borderColor.v._0_8_ = 0;
  local_e8.borderColor.v._8_8_ = 0;
  local_e8.description._M_string_length = 0;
  local_e8.description.field_2._M_local_buf[0] = '\0';
  local_e8.p0.m_data[0] = -0.5;
  local_e8.p0.m_data[1] = 0.75;
  local_e8.p1.m_data[0] = 0.25;
  local_e8.p1.m_data[1] = 1.25;
  local_68.m_data[0] = 0.9;
  local_68.m_data[1] = 0.2;
  local_68.m_data[2] = 0.4;
  local_68.m_data[3] = 0.6;
  local_e8.description._M_dataplus._M_p = (pointer)paVar1;
  GVar11 = mapToFormatColorRepresentable(&local_f0,&local_68);
  local_e8.borderColor.v._0_8_ = GVar11.v._0_8_;
  local_e8.borderColor.v._8_8_ = GVar11.v._8_8_;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(&this->m_iterations,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.description._M_dataplus._M_p,
                    CONCAT71(local_e8.description.field_2._M_allocated_capacity._1_7_,
                             local_e8.description.field_2._M_local_buf[0]) + 1);
  }
  pIVar5 = (this->m_iterations).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_iterations).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5) >> 3) *
          -0x11111111) {
    lVar6 = 0x74;
    lVar7 = 0;
    do {
      if ((this->super_TextureBorderClampTest).m_samplingFunction == SAMPLE_GATHER) {
        pfVar2 = (float *)((long)(pIVar5->p0).m_data + lVar6 + -0x54);
        *pfVar2 = local_58.lookupScale.m_data[0];
        pfVar2[1] = local_58.lookupScale.m_data[0];
        pfVar2[2] = local_58.lookupScale.m_data[0];
        pfVar2[3] = local_58.lookupScale.m_data[0];
        fVar8 = local_58.lookupBias.m_data[0];
        fVar9 = local_58.lookupBias.m_data[0];
        fVar10 = local_58.lookupBias.m_data[0];
      }
      else {
        puVar3 = (undefined8 *)((long)(pIVar5->p0).m_data + lVar6 + -0x54);
        *puVar3 = CONCAT44(local_58.lookupScale.m_data[1],local_58.lookupScale.m_data[0]);
        puVar3[1] = local_58.lookupScale.m_data._8_8_;
        fVar8 = local_58.lookupBias.m_data[1];
        fVar9 = local_58.lookupBias.m_data[2];
        fVar10 = local_58.lookupBias.m_data[3];
      }
      pfVar2 = (float *)((long)(pIVar5->p0).m_data + lVar6 + -0x44);
      *pfVar2 = local_58.lookupBias.m_data[0];
      pfVar2[1] = fVar8;
      pfVar2[2] = fVar9;
      pfVar2[3] = fVar10;
      dVar4 = this->m_filter;
      *(deUint32 *)((long)(pIVar5->p0).m_data + lVar6 + -0x34) = dVar4;
      *(deUint32 *)((long)(&pIVar5->p0 + -6) + lVar6) = dVar4;
      puVar3 = (undefined8 *)((long)(pIVar5->p0).m_data + lVar6 + -0xc);
      *puVar3 = 0x812d0000812d;
      puVar3[1] = 0;
      lVar7 = lVar7 + 1;
      pIVar5 = (this->m_iterations).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x78;
    } while (lVar7 < (int)((ulong)((long)(this->m_iterations).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar5)
                          >> 3) * -0x11111111);
  }
  return (int)pIVar5;
}

Assistant:

void TextureBorderClampFormatCase::init (void)
{
	TextureBorderClampTest::init();

	// \note TextureBorderClampTest::init() creates texture
	const tcu::TextureFormat		texFormat		= tcu::getEffectiveDepthStencilTextureFormat(getTexture()->getRefTexture().getFormat(), m_sampleMode);
	const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

	// iterations

	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-1.5f, -3.0f);
		iteration.p1			= tcu::Vec2( 1.5f,  2.5f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.3f, 0.7f, 0.2f, 0.5f));
		m_iterations.push_back(iteration);
	}
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.5f, 0.75f);
		iteration.p1			= tcu::Vec2(0.25f, 1.25f);
		iteration.borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.9f, 0.2f, 0.4f, 0.6f));
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		if (m_samplingFunction == SAMPLE_GATHER)
		{
			iteration.lookupScale	= tcu::Vec4(texFormatInfo.lookupScale.x());
			iteration.lookupBias	= tcu::Vec4(texFormatInfo.lookupBias.x());
		}
		else
		{
			iteration.lookupScale	= texFormatInfo.lookupScale;
			iteration.lookupBias	= texFormatInfo.lookupBias;
		}

		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.compareMode	= GL_NONE;
		iteration.compareRef	= 0.0f;
	}
}